

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O3

int __thiscall InvertDatabase::make_l2_pass(InvertDatabase *this)

{
  size_type sVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int l2cnt;
  int local_54;
  long local_50;
  value_type_conflict2 local_48 [2];
  size_type local_40;
  long local_38;
  
  local_54 = 0;
  iVar2 = ClassInfo::get_num_class
                    ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(&this->set_sup,(long)this->numfreq);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(&this->seq_sup,(long)this->numfreq);
  uVar5 = this->numfreq;
  if ((int)uVar5 < 1) {
    local_54 = 0;
  }
  else {
    local_40 = (size_type)iVar2;
    lVar6 = 0;
    do {
      uVar3 = (ulong)uVar5;
      if ((int)lVar6 < (int)uVar5) {
        lVar6 = (long)(int)lVar6;
        do {
          uVar5 = (uint)lVar6;
          local_50 = lVar6;
          if (((int)(uVar5 - (int)uVar3) < -1) &&
             (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->max_iset_len)) {
            local_38 = lVar6 * 3;
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::resize((this->set_sup).
                     super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6,
                     (long)(int)((int)uVar3 + ~uVar5));
            sVar1 = local_40;
            uVar3 = (ulong)(uint)this->numfreq;
            if ((int)(uVar5 - this->numfreq) < -1) {
              lVar6 = 0;
              lVar7 = 0;
              do {
                local_48[1] = 0;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           (*(long *)((long)&(((this->set_sup).
                                               super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             )._M_impl.super__Vector_impl_data + local_38 * 8) +
                           lVar6),sVar1,local_48 + 1);
                lVar7 = lVar7 + 1;
                uVar3 = (ulong)(uint)this->numfreq;
                lVar6 = lVar6 + 0x18;
              } while (lVar7 < (int)(this->numfreq + ~uVar5));
            }
          }
          lVar7 = local_50;
          lVar6 = lVar7;
          if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->max_seq_len) {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::resize((this->seq_sup).
                     super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_50,(long)(int)uVar3);
            sVar1 = local_40;
            uVar3 = (ulong)(uint)this->numfreq;
            if (0 < this->numfreq) {
              lVar8 = 0;
              lVar4 = 0;
              do {
                local_48[0] = 0;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           (*(long *)&(this->seq_sup).
                                      super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data + lVar8),sVar1,local_48);
                lVar4 = lVar4 + 1;
                uVar3 = (ulong)this->numfreq;
                lVar8 = lVar8 + 0x18;
                lVar6 = local_50;
              } while (lVar4 < (long)uVar3);
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (int)uVar3);
      }
      if (0 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              num_partitions) {
        iVar2 = 0;
        do {
          process_invert(this,iVar2);
          iVar2 = iVar2 + 1;
        } while (iVar2 < ((this->args).
                          super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         num_partitions);
      }
      get_F2(this,&local_54);
      uVar5 = this->numfreq;
    } while ((int)lVar6 < (int)uVar5);
  }
  return local_54;
}

Assistant:

int InvertDatabase::make_l2_pass() {
    int i, j;

    int l2cnt = 0;
    int num_class = cls->get_num_class();

    // support for 2-itemsets
    set_sup.resize(numfreq);
    seq_sup.resize(numfreq);

    int low, high;

    for (low = 0; low < numfreq; low = high) {
        for (high = low; high < numfreq; high++) {
            if (args->max_iset_len > 1 && numfreq - high - 1 > 0) {
                set_sup[high].resize(numfreq - high - 1);
                for (i = 0; i < numfreq - high - 1; i++) {
                    set_sup[high][i].resize(num_class, 0);
                }
            }
            if (args->max_seq_len > 1) {
                seq_sup[high].resize(numfreq);
                for (i = 0; i < numfreq; i++) {
                    seq_sup[high][i].resize(num_class, 0);
                }
            }
        }
        for (int p = 0; p < args->num_partitions; p++) {
            process_invert(p);
        }
        get_F2(l2cnt);
    }

    return l2cnt;
}